

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.h
# Opt level: O0

void __thiscall
mjs::not_callable_exception::not_callable_exception(not_callable_exception *this,value *v)

{
  value *in_RDX;
  string local_38;
  value *local_18;
  value *v_local;
  not_callable_exception *this_local;
  
  local_18 = v;
  v_local = (value *)this;
  format_error_message_abi_cxx11_(&local_38,(not_callable_exception *)v,in_RDX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__not_callable_exception_002959e0;
  return;
}

Assistant:

explicit not_callable_exception(const value& v) : std::runtime_error(format_error_message(v)) {
    }